

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other.cpp
# Opt level: O0

void another_file(string *path,string *DLL_file)

{
  undefined8 uVar1;
  char *pcVar2;
  double *local_2e98;
  double *local_2e90;
  double *local_2e88;
  double *local_2e80;
  double *local_2e78;
  double *local_2e70;
  double *local_2e68;
  undefined1 *local_2e60;
  double *local_2e58;
  uint *local_2e50;
  double *local_2e48;
  undefined8 local_2e40;
  undefined1 local_2e29;
  undefined8 local_2e28;
  undefined8 uStack_2e20;
  undefined8 local_2e18;
  undefined1 *local_2e10;
  char *local_2e08;
  char *local_2e00;
  undefined8 local_2df8;
  undefined8 uStack_2df0;
  code *local_2de0;
  char *local_2dd8;
  size_t local_2dd0;
  string *local_2dc8;
  undefined1 local_2dba;
  undefined1 local_2db9;
  undefined8 uStack_2db8;
  bool unloaded_REFPROP;
  double w;
  double q;
  double cv;
  double cp;
  double u;
  double s;
  double h;
  double dv;
  double dl;
  double d;
  double p;
  double T;
  double y [20];
  double x [20];
  double z [20];
  char herr_1 [255];
  uint local_2a6c;
  undefined8 uStack_2a68;
  int ierr_1;
  char href [255];
  char hhmx [255];
  char hfld [10000];
  char herr [255];
  uint local_50;
  int nc;
  int ierr;
  byte local_39;
  undefined1 local_38 [7];
  bool loaded_REFPROP;
  string err;
  string *DLL_file_local;
  string *path_local;
  
  local_2dc8 = (string *)local_38;
  err.field_2._8_8_ = DLL_file;
  std::__cxx11::string::string((string *)local_2dc8);
  local_2dba = load_REFPROP(local_2dc8,path,(string *)err.field_2._8_8_);
  local_2dd8 = "false";
  if ((bool)local_2dba) {
    local_2dd8 = "true";
  }
  local_39 = local_2dba;
  local_2dd0 = REFPROP_address();
  printf("Loaded refprop (in other.cpp): %s @ address %zu\n",local_2dd8,local_2dd0);
  local_2de0 = (code *)SETPATHdll;
  uVar1 = std::__cxx11::string::c_str();
  (*local_2de0)(uVar1,400);
  local_50 = 0;
  stack0xffffffffffffffac = 1;
  local_2e08 = hhmx + 0xf8;
  memcpy(local_2e08,"R32.FLD",10000);
  local_2e00 = href + 0xf8;
  memcpy(local_2e00,"HMX.BNC",0xff);
  local_2df8 = 0;
  uStack_2df0 = 0;
  href[0xe8] = '\0';
  href[0xe9] = '\0';
  href[0xea] = '\0';
  href[0xeb] = '\0';
  href[0xec] = '\0';
  href[0xed] = '\0';
  href[0xee] = '\0';
  href[0xef] = '\0';
  href[0xf0] = '\0';
  href[0xf1] = '\0';
  href[0xf2] = '\0';
  href[0xf3] = '\0';
  href[0xf4] = '\0';
  href[0xf5] = '\0';
  href[0xf6] = '\0';
  href[0xd8] = '\0';
  href[0xd9] = '\0';
  href[0xda] = '\0';
  href[0xdb] = '\0';
  href[0xdc] = '\0';
  href[0xdd] = '\0';
  href[0xde] = '\0';
  href[0xdf] = '\0';
  href[0xe0] = '\0';
  href[0xe1] = '\0';
  href[0xe2] = '\0';
  href[0xe3] = '\0';
  href[0xe4] = '\0';
  href[0xe5] = '\0';
  href[0xe6] = '\0';
  href[0xe7] = '\0';
  href[200] = '\0';
  href[0xc9] = '\0';
  href[0xca] = '\0';
  href[0xcb] = '\0';
  href[0xcc] = '\0';
  href[0xcd] = '\0';
  href[0xce] = '\0';
  href[0xcf] = '\0';
  href[0xd0] = '\0';
  href[0xd1] = '\0';
  href[0xd2] = '\0';
  href[0xd3] = '\0';
  href[0xd4] = '\0';
  href[0xd5] = '\0';
  href[0xd6] = '\0';
  href[0xd7] = '\0';
  href[0xb8] = '\0';
  href[0xb9] = '\0';
  href[0xba] = '\0';
  href[0xbb] = '\0';
  href[0xbc] = '\0';
  href[0xbd] = '\0';
  href[0xbe] = '\0';
  href[0xbf] = '\0';
  href[0xc0] = '\0';
  href[0xc1] = '\0';
  href[0xc2] = '\0';
  href[0xc3] = '\0';
  href[0xc4] = '\0';
  href[0xc5] = '\0';
  href[0xc6] = '\0';
  href[199] = '\0';
  href[0xa8] = '\0';
  href[0xa9] = '\0';
  href[0xaa] = '\0';
  href[0xab] = '\0';
  href[0xac] = '\0';
  href[0xad] = '\0';
  href[0xae] = '\0';
  href[0xaf] = '\0';
  href[0xb0] = '\0';
  href[0xb1] = '\0';
  href[0xb2] = '\0';
  href[0xb3] = '\0';
  href[0xb4] = '\0';
  href[0xb5] = '\0';
  href[0xb6] = '\0';
  href[0xb7] = '\0';
  href[0x98] = '\0';
  href[0x99] = '\0';
  href[0x9a] = '\0';
  href[0x9b] = '\0';
  href[0x9c] = '\0';
  href[0x9d] = '\0';
  href[0x9e] = '\0';
  href[0x9f] = '\0';
  href[0xa0] = '\0';
  href[0xa1] = '\0';
  href[0xa2] = '\0';
  href[0xa3] = '\0';
  href[0xa4] = '\0';
  href[0xa5] = '\0';
  href[0xa6] = '\0';
  href[0xa7] = '\0';
  href[0x88] = '\0';
  href[0x89] = '\0';
  href[0x8a] = '\0';
  href[0x8b] = '\0';
  href[0x8c] = '\0';
  href[0x8d] = '\0';
  href[0x8e] = '\0';
  href[0x8f] = '\0';
  href[0x90] = '\0';
  href[0x91] = '\0';
  href[0x92] = '\0';
  href[0x93] = '\0';
  href[0x94] = '\0';
  href[0x95] = '\0';
  href[0x96] = '\0';
  href[0x97] = '\0';
  href[0x78] = '\0';
  href[0x79] = '\0';
  href[0x7a] = '\0';
  href[0x7b] = '\0';
  href[0x7c] = '\0';
  href[0x7d] = '\0';
  href[0x7e] = '\0';
  href[0x7f] = '\0';
  href[0x80] = '\0';
  href[0x81] = '\0';
  href[0x82] = '\0';
  href[0x83] = '\0';
  href[0x84] = '\0';
  href[0x85] = '\0';
  href[0x86] = '\0';
  href[0x87] = '\0';
  href[0x68] = '\0';
  href[0x69] = '\0';
  href[0x6a] = '\0';
  href[0x6b] = '\0';
  href[0x6c] = '\0';
  href[0x6d] = '\0';
  href[0x6e] = '\0';
  href[0x6f] = '\0';
  href[0x70] = '\0';
  href[0x71] = '\0';
  href[0x72] = '\0';
  href[0x73] = '\0';
  href[0x74] = '\0';
  href[0x75] = '\0';
  href[0x76] = '\0';
  href[0x77] = '\0';
  href[0x58] = '\0';
  href[0x59] = '\0';
  href[0x5a] = '\0';
  href[0x5b] = '\0';
  href[0x5c] = '\0';
  href[0x5d] = '\0';
  href[0x5e] = '\0';
  href[0x5f] = '\0';
  href[0x60] = '\0';
  href[0x61] = '\0';
  href[0x62] = '\0';
  href[99] = '\0';
  href[100] = '\0';
  href[0x65] = '\0';
  href[0x66] = '\0';
  href[0x67] = '\0';
  href[0x48] = '\0';
  href[0x49] = '\0';
  href[0x4a] = '\0';
  href[0x4b] = '\0';
  href[0x4c] = '\0';
  href[0x4d] = '\0';
  href[0x4e] = '\0';
  href[0x4f] = '\0';
  href[0x50] = '\0';
  href[0x51] = '\0';
  href[0x52] = '\0';
  href[0x53] = '\0';
  href[0x54] = '\0';
  href[0x55] = '\0';
  href[0x56] = '\0';
  href[0x57] = '\0';
  href[0x38] = '\0';
  href[0x39] = '\0';
  href[0x3a] = '\0';
  href[0x3b] = '\0';
  href[0x3c] = '\0';
  href[0x3d] = '\0';
  href[0x3e] = '\0';
  href[0x3f] = '\0';
  href[0x40] = '\0';
  href[0x41] = '\0';
  href[0x42] = '\0';
  href[0x43] = '\0';
  href[0x44] = '\0';
  href[0x45] = '\0';
  href[0x46] = '\0';
  href[0x47] = '\0';
  href[0x28] = '\0';
  href[0x29] = '\0';
  href[0x2a] = '\0';
  href[0x2b] = '\0';
  href[0x2c] = '\0';
  href[0x2d] = '\0';
  href[0x2e] = '\0';
  href[0x2f] = '\0';
  href[0x30] = '\0';
  href[0x31] = '\0';
  href[0x32] = '\0';
  href[0x33] = '\0';
  href[0x34] = '\0';
  href[0x35] = '\0';
  href[0x36] = '\0';
  href[0x37] = '\0';
  href[0x18] = '\0';
  href[0x19] = '\0';
  href[0x1a] = '\0';
  href[0x1b] = '\0';
  href[0x1c] = '\0';
  href[0x1d] = '\0';
  href[0x1e] = '\0';
  href[0x1f] = '\0';
  href[0x20] = '\0';
  href[0x21] = '\0';
  href[0x22] = '\0';
  href[0x23] = '\0';
  href[0x24] = '\0';
  href[0x25] = '\0';
  href[0x26] = '\0';
  href[0x27] = '\0';
  href[8] = '\0';
  href[9] = '\0';
  href[10] = '\0';
  href[0xb] = '\0';
  href[0xc] = '\0';
  href[0xd] = '\0';
  href[0xe] = '\0';
  href[0xf] = '\0';
  href[0x10] = '\0';
  href[0x11] = '\0';
  href[0x12] = '\0';
  href[0x13] = '\0';
  href[0x14] = '\0';
  href[0x15] = '\0';
  href[0x16] = '\0';
  href[0x17] = '\0';
  href[0] = '\0';
  href[1] = '\0';
  href[2] = '\0';
  href[3] = '\0';
  href[4] = '\0';
  href[5] = '\0';
  href[6] = '\0';
  href[7] = '\0';
  uStack_2a68 = 0x464544;
  local_2e80 = (double *)0xff;
  local_2e88 = (double *)0x3;
  local_2e90 = (double *)0xff;
  local_2e98 = (double *)0x2710;
  (*(code *)SETUPdll)(herr + 0xfc,local_2e08,local_2e00,&stack0xffffffffffffd598,&local_50,
                      hfld + 0x2708);
  if (0 < (int)local_50) {
    printf("Other ierr: %ld herr: %s\n",(ulong)local_50,hfld + 0x2708);
  }
  local_2a6c = 0;
  local_2e28 = 0;
  uStack_2e20 = 0;
  z[0x11] = 0.0;
  z[0x12] = 0.0;
  z[0xf] = 0.0;
  z[0x10] = 0.0;
  z[0xd] = 0.0;
  z[0xe] = 0.0;
  z[0xb] = 0.0;
  z[0xc] = 0.0;
  z[9] = 0.0;
  z[10] = 0.0;
  z[7] = 0.0;
  z[8] = 0.0;
  z[5] = 0.0;
  z[6] = 0.0;
  z[3] = 0.0;
  z[4] = 0.0;
  z[1] = 0.0;
  z[2] = 0.0;
  z[0] = 0.0;
  x[0x13] = 1.0;
  x[0x11] = 0.0;
  x[0x12] = 0.0;
  x[0xf] = 0.0;
  x[0x10] = 0.0;
  x[0xd] = 0.0;
  x[0xe] = 0.0;
  x[0xb] = 0.0;
  x[0xc] = 0.0;
  x[9] = 0.0;
  x[10] = 0.0;
  x[7] = 0.0;
  x[8] = 0.0;
  x[5] = 0.0;
  x[6] = 0.0;
  x[3] = 0.0;
  x[4] = 0.0;
  x[1] = 0.0;
  x[2] = 0.0;
  x[0] = 0.0;
  y[0x13] = 1.0;
  y[0x11] = 0.0;
  y[0x12] = 0.0;
  y[0xf] = 0.0;
  y[0x10] = 0.0;
  y[0xd] = 0.0;
  y[0xe] = 0.0;
  y[0xb] = 0.0;
  y[0xc] = 0.0;
  y[9] = 0.0;
  y[10] = 0.0;
  y[7] = 0.0;
  y[8] = 0.0;
  y[5] = 0.0;
  y[6] = 0.0;
  y[3] = 0.0;
  y[4] = 0.0;
  y[1] = 0.0;
  y[2] = 0.0;
  y[0] = 0.0;
  T = 1.0;
  p = 300.0;
  d = 101.325;
  local_2e18 = 0xbff0000000000000;
  dl = -1.0;
  dv = -1.0;
  h = -1.0;
  s = -1.0;
  u = -1.0;
  cp = -1.0;
  cv = -1.0;
  q = -1.0;
  w = -1.0;
  uStack_2db8 = 0xbff0000000000000;
  local_2e48 = z + 0x13;
  local_2e50 = &local_2a6c;
  local_2e58 = &w;
  local_2e60 = (undefined1 *)&stack0xffffffffffffd248;
  local_2e68 = &q;
  local_2e70 = &cv;
  local_2e78 = &cp;
  local_2e80 = &u;
  local_2e88 = &s;
  local_2e90 = &T;
  local_2e98 = y + 0x13;
  local_2e40 = 0xff;
  local_2e10 = (undefined1 *)&local_2e98;
  (*(code *)TPFLSHdll)(&p,&d,x + 0x13,&dl,&dv,&h);
  if (0 < (int)local_2a6c) {
    printf("Other ierr: %ld herr: %s\n",(ulong)local_2a6c,z + 0x13);
  }
  printf("Other d: %g mol/L\n",SUB84(dl,0));
  local_2e29 = unload_REFPROP((string *)local_38);
  pcVar2 = "false";
  if ((local_39 & 1) != 0) {
    pcVar2 = "true";
  }
  local_2db9 = local_2e29;
  printf("Unloaded refprop (in other.cpp): %s\n",pcVar2);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void another_file(const std::string & path, const std::string &DLL_file)
{

    // Load the shared library
    std::string err;
    bool loaded_REFPROP = load_REFPROP(err, path, DLL_file);
    printf("Loaded refprop (in other.cpp): %s @ address %zu\n", loaded_REFPROP ? "true" : "false", REFPROP_address());

    // Set the loading path
    SETPATHdll(const_cast<char*>(path.c_str()), 400);

    int ierr = 0, nc = 1;
    char herr[255], hfld[10000] = "R32.FLD", hhmx[255] = "HMX.BNC", href[255] = "DEF";
    SETUPdll(nc,hfld,hhmx,href,ierr,herr,10000,255,3,255);
    if (ierr > 0) printf("Other ierr: %ld herr: %s\n", ierr, herr);
    {
        int ierr = 0;
        char herr[255];
        double z[20] = {1.0}, x[20] = {1.0}, y[20] = {1.0}, T= 300, p = 101.325, d = -1, dl = -1, dv = -1, h = -1, s = -1, u = -1, cp = -1, cv = -1, q = -1, w = -1;
        TPFLSHdll(T, p, z, d, dl, dv, x, y, h,s,u,cp,cv,w,q,ierr,herr,255);
        if (ierr > 0) printf("Other ierr: %ld herr: %s\n", ierr, herr);
        printf("Other d: %g mol/L\n", d);
    }

    bool unloaded_REFPROP = unload_REFPROP(err);
    printf("Unloaded refprop (in other.cpp): %s\n", loaded_REFPROP ? "true" : "false");
}